

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

bool __thiscall
option::PrintUsageImplementation::LinePartIterator::nextTable(LinePartIterator *this)

{
  bool bVar1;
  LinePartIterator *this_local;
  
  if (this->rowdesc != (Descriptor *)0x0) {
    while( true ) {
      bVar1 = false;
      if (this->tablestart->help != (char *)0x0) {
        bVar1 = this->tablestart->shortopt != (char *)0x0;
      }
      if (!bVar1) break;
      this->tablestart = this->tablestart + 1;
    }
  }
  while( true ) {
    bVar1 = false;
    if (this->tablestart->help == (char *)0x0) {
      bVar1 = this->tablestart->shortopt != (char *)0x0;
    }
    if (!bVar1) break;
    this->tablestart = this->tablestart + 1;
  }
  restartTable(this);
  return this->rowstart != (char *)0x0;
}

Assistant:

bool nextTable()
    {
      // If this is NOT the first time nextTable() is called after the constructor,
      // then skip to the next table break (i.e. a Descriptor with help == 0)
      if (rowdesc != 0)
      {
        while (tablestart->help != 0 && tablestart->shortopt != 0)
          ++tablestart;
      }

      // Find the next table after the break (if any)
      while (tablestart->help == 0 && tablestart->shortopt != 0)
        ++tablestart;

      restartTable();
      return rowstart != 0;
    }